

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_2::verifyImageWithVerifier
               (Surface *resultImage,TestLog *log,Verifier *verifier,bool logOnSuccess)

{
  ostringstream *this;
  int iVar1;
  TestLog *pTVar2;
  undefined7 in_register_00000009;
  ConstPixelBufferAccess *pCVar3;
  LogImageSet *access;
  ChannelType CVar4;
  ChannelType CVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder CVar6;
  void *pvVar7;
  Surface errorMask;
  RGBA color;
  string local_448;
  undefined4 local_424;
  string local_420;
  Surface local_400;
  string local_3e8;
  string local_3c8;
  TextureFormat local_3a8;
  undefined1 local_3a0 [40];
  undefined1 local_378 [40];
  string local_350;
  string local_330;
  LogImageSet local_310;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  tcu::Surface::Surface(&local_400,resultImage->m_width,resultImage->m_height);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar7 = (void *)local_400.m_pixels.m_cap;
  if ((void *)local_400.m_pixels.m_cap != (void *)0x0) {
    pvVar7 = local_400.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_400.m_width,
             local_400.m_height,1,pvVar7);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2d0.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d0);
  if (logOnSuccess) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying image.",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_138);
    (*verifier->_vptr_Verifier[1])(verifier,log);
  }
  CVar4 = SNORM_INT8;
  CVar5 = CVar4;
  if (0 < resultImage->m_height) {
    local_424 = (undefined4)CONCAT71(in_register_00000009,logOnSuccess);
    CVar5 = SNORM_INT8;
    do {
      iVar1 = resultImage->m_width;
      if (0 < iVar1) {
        CVar6 = R;
        do {
          local_2d0.m_name._M_dataplus._M_p._0_4_ =
               *(undefined4 *)
                ((long)(resultImage->m_pixels).m_ptr + (long)(int)(iVar1 * CVar4 + CVar6) * 4);
          local_1b0._4_4_ = CVar4;
          local_1b0._0_4_ = CVar6;
          iVar1 = (**verifier->_vptr_Verifier)(verifier,&local_2d0,local_1b0);
          if ((char)iVar1 == '\0') {
            *(undefined4 *)
             ((long)local_400.m_pixels.m_ptr + (long)(int)(local_400.m_width * CVar4 + CVar6) * 4) =
                 0xff0000ff;
            CVar5 = SNORM_INT16;
          }
          CVar6 = CVar6 + A;
          iVar1 = resultImage->m_width;
        } while ((int)CVar6 < iVar1);
      }
      CVar4 = CVar4 + SNORM_INT16;
    } while ((int)CVar4 < resultImage->m_height);
    logOnSuccess = SUB41(local_424,0);
  }
  if (CVar5 == SNORM_INT8) {
    if (logOnSuccess == false) goto LAB_01463a90;
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification passed.",0x1a);
    pTVar2 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_378._0_8_ = (long)local_378 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Verification","");
    local_3a0._0_8_ = (long)local_3a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Image Verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_378,(string *)local_3a0)
    ;
    tcu::TestLog::startImageSet
              (pTVar2,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Result","");
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Result image","");
    local_3c8._M_dataplus._M_p = (pointer)0x300000008;
    pvVar7 = (void *)(resultImage->m_pixels).m_cap;
    if (pvVar7 != (void *)0x0) {
      pvVar7 = (resultImage->m_pixels).m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_310,(TextureFormat *)&local_3c8,resultImage->m_width
               ,resultImage->m_height,1,pvVar7);
    access = &local_310;
    tcu::LogImage::LogImage
              (&local_2d0,&local_420,&local_448,(ConstPixelBufferAccess *)access,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d0,(int)pTVar2,__buf_01,(size_t)access);
    tcu::TestLog::endImageSet(pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0._0_8_ != (long)local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
    if (local_378._0_8_ != (long)local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
  }
  else {
    if (logOnSuccess == false) {
      (*verifier->_vptr_Verifier[1])(verifier,log);
    }
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
    pTVar2 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Verification","");
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Image Verification","");
    tcu::LogImageSet::LogImageSet(&local_310,&local_420,&local_448);
    tcu::TestLog::startImageSet
              (pTVar2,local_310.m_name._M_dataplus._M_p,local_310.m_description._M_dataplus._M_p);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Result","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result image","");
    local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
    pvVar7 = (void *)(resultImage->m_pixels).m_cap;
    if (pvVar7 != (void *)0x0) {
      pvVar7 = (resultImage->m_pixels).m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_378,(TextureFormat *)&local_240,resultImage->m_width,
               resultImage->m_height,1,pvVar7);
    pCVar3 = (ConstPixelBufferAccess *)local_378;
    tcu::LogImage::LogImage(&local_2d0,&local_3c8,&local_3e8,pCVar3,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d0,(int)pTVar2,__buf,(size_t)pCVar3);
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ErrorMask","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Error Mask","");
    local_3a8.order = RGBA;
    local_3a8.type = UNORM_INT8;
    if ((void *)local_400.m_pixels.m_cap != (void *)0x0) {
      local_400.m_pixels.m_cap = (size_t)local_400.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_3a0,&local_3a8,local_400.m_width,local_400.m_height,1,
               (void *)local_400.m_pixels.m_cap);
    pCVar3 = (ConstPixelBufferAccess *)local_3a0;
    tcu::LogImage::LogImage(&local_240,&local_330,&local_350,pCVar3,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,(int)pTVar2,__buf_00,(size_t)pCVar3);
    tcu::TestLog::endImageSet(pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
      operator_delete(local_310.m_description._M_dataplus._M_p,
                      local_310.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_name._M_dataplus._M_p != &local_310.m_name.field_2) {
      operator_delete(local_310.m_name._M_dataplus._M_p,
                      local_310.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
LAB_01463a90:
  tcu::Surface::~Surface(&local_400);
  return (bool)(~(byte)CVar5 & 1);
}

Assistant:

static bool verifyImageWithVerifier (const tcu::Surface& resultImage, tcu::TestLog& log, const Verifier& verifier, bool logOnSuccess = true)
{
	tcu::Surface	errorMask	(resultImage.getWidth(), resultImage.getHeight());
	bool			error		= false;

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Verifying image." << tcu::TestLog::EndMessage;
		verifier.logInfo(log);
	}

	for (int y = 0; y < resultImage.getHeight(); ++y)
	for (int x = 0; x < resultImage.getWidth(); ++x)
	{
		const tcu::RGBA color		= resultImage.getPixel(x, y);

		// verify color value is valid for this pixel position
		if (!verifier.verify(color, tcu::IVec2(x,y)))
		{
			error = true;
			errorMask.setPixel(x, y, tcu::RGBA::red());
		}
	}

	if (error)
	{
		// describe the verification logic if we haven't already
		if (!logOnSuccess)
			verifier.logInfo(log);

		log	<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
	else if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Image verification passed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}